

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O1

void __thiscall gvr::PLYElement::addProperty(PLYElement *this,PLYProperty *p)

{
  pointer *ppPVar1;
  PLYProperty *this_00;
  PLYProperty *pPVar2;
  PLYProperty *this_01;
  long lVar3;
  ulong uVar4;
  pointer pPVar5;
  long lVar6;
  pointer pPVar7;
  ulong uVar8;
  ulong uVar9;
  
  this_00 = (this->list).
            super__Vector_base<gvr::(anonymous_namespace)::PLYProperty,_std::allocator<gvr::(anonymous_namespace)::PLYProperty>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (this_00 ==
      (this->list).
      super__Vector_base<gvr::(anonymous_namespace)::PLYProperty,_std::allocator<gvr::(anonymous_namespace)::PLYProperty>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    pPVar2 = (this->list).
             super__Vector_base<gvr::(anonymous_namespace)::PLYProperty,_std::allocator<gvr::(anonymous_namespace)::PLYProperty>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((long)this_00 - (long)pPVar2 == 0x7fffffffffffffc0) {
      std::__throw_length_error("vector::_M_realloc_insert");
    }
    uVar8 = (long)this_00 - (long)pPVar2 >> 6;
    uVar4 = 1;
    if (this_00 != pPVar2) {
      uVar4 = uVar8;
    }
    uVar9 = uVar4 + uVar8;
    if (0x1fffffffffffffe < uVar9) {
      uVar9 = 0x1ffffffffffffff;
    }
    if (CARRY8(uVar4,uVar8)) {
      uVar9 = 0x1ffffffffffffff;
    }
    if (uVar9 == 0) {
      pPVar5 = (pointer)0x0;
    }
    else {
      pPVar5 = (pointer)operator_new(uVar9 << 6);
    }
    anon_unknown_3::PLYProperty::PLYProperty(pPVar5 + uVar8,p);
    this_01 = pPVar2;
    pPVar7 = pPVar5;
    if (this_00 != pPVar2) {
      lVar3 = 0;
      do {
        lVar6 = lVar3;
        anon_unknown_3::PLYProperty::PLYProperty
                  ((PLYProperty *)((long)&pPVar5->enc + lVar6),
                   (PLYProperty *)((long)&pPVar2->enc + lVar6));
        lVar3 = lVar6 + 0x40;
      } while ((PLYProperty *)((long)&pPVar2[1].enc + lVar6) != this_00);
      pPVar7 = (pointer)((long)&pPVar5[1].enc + lVar6);
    }
    for (; this_00 != this_01; this_01 = this_01 + 1) {
      anon_unknown_3::PLYProperty::~PLYProperty(this_01);
    }
    if (pPVar2 != (PLYProperty *)0x0) {
      operator_delete(pPVar2);
    }
    (this->list).
    super__Vector_base<gvr::(anonymous_namespace)::PLYProperty,_std::allocator<gvr::(anonymous_namespace)::PLYProperty>_>
    ._M_impl.super__Vector_impl_data._M_start = pPVar5;
    (this->list).
    super__Vector_base<gvr::(anonymous_namespace)::PLYProperty,_std::allocator<gvr::(anonymous_namespace)::PLYProperty>_>
    ._M_impl.super__Vector_impl_data._M_finish = pPVar7 + 1;
    (this->list).
    super__Vector_base<gvr::(anonymous_namespace)::PLYProperty,_std::allocator<gvr::(anonymous_namespace)::PLYProperty>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = pPVar5 + uVar9;
  }
  else {
    anon_unknown_3::PLYProperty::PLYProperty(this_00,p);
    ppPVar1 = &(this->list).
               super__Vector_base<gvr::(anonymous_namespace)::PLYProperty,_std::allocator<gvr::(anonymous_namespace)::PLYProperty>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppPVar1 = *ppPVar1 + 1;
  }
  return;
}

Assistant:

void addProperty(const PLYProperty &p) { list.push_back(p); }